

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall
pbrt::CameraSceneEntity::CameraSceneEntity
          (CameraSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          CameraTransform *cameraTransform,string *medium)

{
  ParameterDictionary parameters_00;
  undefined1 in_stack_ffffffffffffff70 [80];
  FileLoc in_stack_ffffffffffffffc0;
  
  ParameterDictionary::ParameterDictionary
            ((ParameterDictionary *)&stack0xffffffffffffff70,parameters);
  parameters_00._24_80_ = in_stack_ffffffffffffff70;
  parameters_00.params._0_24_ = loc;
  SceneEntity::SceneEntity(&this->super_SceneEntity,name,parameters_00,in_stack_ffffffffffffffc0);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)&stack0xffffffffffffff70);
  memcpy(&this->cameraTransform,cameraTransform,0x338);
  std::__cxx11::string::string((string *)&this->medium,(string *)medium);
  return;
}

Assistant:

CameraSceneEntity(const std::string &name, ParameterDictionary parameters,
                      FileLoc loc, const CameraTransform &cameraTransform,
                      const std::string &medium)
        : SceneEntity(name, parameters, loc),
          cameraTransform(cameraTransform),
          medium(medium) {}